

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_file.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::javanano::FileGenerator::Validate(FileGenerator *this,string *error)

{
  uint uVar1;
  Params *pPVar2;
  pointer __s2;
  size_t __n;
  long lVar3;
  bool bVar4;
  int iVar5;
  const_iterator cVar6;
  ostream *poVar7;
  ulong uVar8;
  ulong uVar9;
  FileDescriptor *pFVar10;
  long lVar11;
  bool bVar12;
  FileDescriptorProto file_proto;
  FileDescriptorProto local_108;
  
  FileDescriptorProto::FileDescriptorProto(&local_108);
  FileDescriptor::CopyTo(this->file_,&local_108);
  bVar4 = anon_unknown_4::UsesExtensions(&local_108.super_Message);
  if ((bVar4) && (this->params_->store_unknown_fields_ == false)) {
    std::__cxx11::string::_M_assign((string *)error);
LAB_00279563:
    std::__cxx11::string::append((char *)error);
  }
  else {
    if ((*(int *)(this->file_ + 0x78) != 0) && (this->params_->ignore_services_ == false)) {
      std::__cxx11::string::_M_assign((string *)error);
      goto LAB_00279563;
    }
    bVar4 = IsOuterClassNeeded(this->params_,this->file_);
    bVar12 = true;
    if (!bVar4) goto LAB_00279631;
    pPVar2 = this->params_;
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(pPVar2->java_outer_classnames_)._M_t,*(key_type **)this->file_);
    pFVar10 = this->file_;
    if (((((_Rb_tree_header *)cVar6._M_node ==
           &(pPVar2->java_outer_classnames_)._M_t._M_impl.super__Rb_tree_header) &&
         (*(int *)(pFVar10 + 0x58) == 1)) && (*(int *)(pFVar10 + 0x68) == 0)) &&
       (*(int *)(pFVar10 + 0x88) == 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"INFO: ",6);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)**(undefined8 **)this->file_,
                          (*(undefined8 **)this->file_)[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
      std::endl<char,std::char_traits<char>>(poVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Javanano generator has changed to align with java generator. An outer class will be created for this file and the single message in the file will become a nested class. Use java_multiple_files to skip generating the outer class, or set an explicit java_outer_classname to suppress this message."
                 ,0x126);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      pFVar10 = this->file_;
    }
    uVar1 = *(uint *)(pFVar10 + 0x58);
    __s2 = (this->classname_)._M_dataplus._M_p;
    __n = (this->classname_)._M_string_length;
    bVar4 = true;
    if (0 < (int)uVar1) {
      lVar3 = *(long *)(pFVar10 + 0x60);
      lVar11 = 0;
      do {
        if (((*(undefined8 **)(lVar3 + lVar11))[1] == __n) &&
           ((__n == 0 ||
            (iVar5 = bcmp((void *)**(undefined8 **)(lVar3 + lVar11),__s2,__n), iVar5 == 0)))) {
          bVar4 = false;
          break;
        }
        lVar11 = lVar11 + 0xa8;
      } while ((ulong)uVar1 * 0xa8 - lVar11 != 0);
    }
    if ((bVar4) && (this->params_->java_enum_style_ != false)) {
      uVar9 = (ulong)*(uint *)(pFVar10 + 0x68);
      if ((int)*(uint *)(pFVar10 + 0x68) < 1) {
        uVar9 = 0;
      }
      uVar8 = 0;
      do {
        if (uVar9 * 0x38 + 0x38 == uVar8 + 0x38) goto LAB_002795e7;
      } while ((((*(undefined8 **)(*(long *)(pFVar10 + 0x70) + uVar8))[1] != __n) ||
               ((__n != 0 &&
                (iVar5 = bcmp((void *)**(undefined8 **)(*(long *)(pFVar10 + 0x70) + uVar8),__s2,__n)
                , iVar5 != 0)))) && (uVar8 = uVar8 + 0x38, bVar4));
    }
    else {
LAB_002795e7:
      bVar12 = true;
      if (bVar4) goto LAB_00279631;
    }
    std::__cxx11::string::_M_assign((string *)error);
    std::__cxx11::string::append((char *)error);
    std::__cxx11::string::_M_append((char *)error,(ulong)(this->classname_)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)error);
  }
  bVar12 = false;
LAB_00279631:
  FileDescriptorProto::~FileDescriptorProto(&local_108);
  return bVar12;
}

Assistant:

bool FileGenerator::Validate(string* error) {
  // Check for extensions
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);
  if (UsesExtensions(file_proto) && !params_.store_unknown_fields()) {
    error->assign(file_->name());
    error->append(
        ": Java NANO_RUNTIME only supports extensions when the "
        "'store_unknown_fields' generator option is 'true'.");
    return false;
  }

  if (file_->service_count() != 0 && !params_.ignore_services()) {
    error->assign(file_->name());
    error->append(
      ": Java NANO_RUNTIME does not support services\"");
    return false;
  }

  if (!IsOuterClassNeeded(params_, file_)) {
    return true;
  }

  // Check whether legacy javanano generator would omit the outer class.
  if (!params_.has_java_outer_classname(file_->name())
      && file_->message_type_count() == 1
      && file_->enum_type_count() == 0 && file_->extension_count() == 0) {
    cout << "INFO: " << file_->name() << ":" << endl;
    cout << "Javanano generator has changed to align with java generator. "
        "An outer class will be created for this file and the single message "
        "in the file will become a nested class. Use java_multiple_files to "
        "skip generating the outer class, or set an explicit "
        "java_outer_classname to suppress this message." << endl;
  }

  // Check that no class name matches the file's class name.  This is a common
  // problem that leads to Java compile errors that can be hard to understand.
  // It's especially bad when using the java_multiple_files, since we would
  // end up overwriting the outer class with one of the inner ones.
  bool found_conflict = false;
  for (int i = 0; !found_conflict && i < file_->message_type_count(); i++) {
    if (file_->message_type(i)->name() == classname_) {
      found_conflict = true;
    }
  }
  if (params_.java_enum_style()) {
    for (int i = 0; !found_conflict && i < file_->enum_type_count(); i++) {
      if (file_->enum_type(i)->name() == classname_) {
        found_conflict = true;
      }
    }
  }
  if (found_conflict) {
    error->assign(file_->name());
    error->append(
      ": Cannot generate Java output because the file's outer class name, \"");
    error->append(classname_);
    error->append(
      "\", matches the name of one of the types declared inside it.  "
      "Please either rename the type or use the java_outer_classname "
      "option to specify a different outer class name for the .proto file.");
    return false;
  }
  return true;
}